

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
               *this,Tmp_column *column,
              vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH,Index currentIndex)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Index local_34;
  Column *local_30;
  Column *col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  Index currentIndex_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInH_local;
  Tmp_column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
  *this_local;
  
  col._4_4_ = currentIndex;
  pvStack_20 = chainsInH;
  chainsInH_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)column;
  column_local = (Tmp_column *)this;
  local_30 = get_column(this,currentIndex);
  _add_to(this,local_30,(Tmp_column *)chainsInH_local,1);
  this_00 = pvStack_20;
  local_34 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
             ::get_paired_chain_index(&local_30->super_Chain_column_option);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_34);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}